

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Own<const_kj::Directory> __thiscall
kj::Directory::openSubdir(Directory *this,PathPtr path,WriteMode mode)

{
  Clock *clock;
  undefined4 in_register_0000000c;
  int line;
  Directory *extraout_RDX;
  Directory *pDVar1;
  ulong in_R8;
  char *macroArgs;
  char *params;
  Own<kj::Directory> OVar2;
  Own<const_kj::Directory> OVar3;
  Fault f;
  _func_int **pp_Stack_30;
  PathPtr path_local;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x88))(&f);
  if (pp_Stack_30 != (_func_int **)0x0) {
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = pp_Stack_30;
    pDVar1 = extraout_RDX;
    goto LAB_00344047;
  }
  if ((in_R8 & 1) == 0) {
    if ((in_R8 & 2) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x266,FAILED,(char *)0x0,
                 "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                 (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                 &path_local);
    }
    else {
      params = "directory does not exist";
      macroArgs = "\"directory does not exist\", path";
      line = 0x264;
LAB_00343fe5:
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,line,FAILED,(char *)0x0,macroArgs,(char (*) [25])params,&path_local);
    }
  }
  else {
    if ((in_R8 & 2) == 0) {
      params = "directory already exists";
      macroArgs = "\"directory already exists\", path";
      line = 0x262;
      goto LAB_00343fe5;
    }
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x269,FAILED,(char *)0x0,
               "\"tryOpenSubdir() returned null despite no preconditions\", path",
               (char (*) [55])"tryOpenSubdir() returned null despite no preconditions",&path_local);
  }
  _::Debug::Fault::~Fault(&f);
  clock = nullClock();
  OVar2 = newInMemoryDirectory((kj *)&f,clock);
  pDVar1 = OVar2.ptr;
  (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
  this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
LAB_00344047:
  OVar3.ptr = pDVar1;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<const Directory> Directory::openSubdir(PathPtr path, WriteMode mode) const {
  KJ_IF_MAYBE(f, tryOpenSubdir(path, mode)) {
    return kj::mv(*f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("directory already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("directory does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryOpenSubdir() returned null despite no preconditions", path) { break; }